

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

void __thiscall
MuxerManager::MuxerManager
          (MuxerManager *this,BufferedReaderManager *readManager,AbstractMuxerFactory *factory)

{
  AbstractMuxerFactory *factory_local;
  BufferedReaderManager *readManager_local;
  MuxerManager *this_local;
  
  std::__cxx11::string::string((string *)&this->m_outFileName);
  std::condition_variable::condition_variable(&this->reinitCond);
  METADemuxer::METADemuxer(&this->m_metaDemuxer,readManager);
  this->m_factory = factory;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->m_subStreamIndex);
  std::__cxx11::string::string((string *)&this->m_muxOpts);
  std::vector<WriterData,_std::allocator<WriterData>_>::vector(&this->m_delayedData);
  this->m_reproducibleIsoHeader = false;
  this->m_asyncMode = true;
  this->m_fileWriter = (BufferedFileWriter *)0x0;
  this->m_cutStart = 0;
  this->m_cutEnd = 0;
  this->m_subMuxer = (AbstractMuxer *)0x0;
  this->m_mainMuxer = (AbstractMuxer *)0x0;
  this->m_allowStereoMux = false;
  this->m_interleave = false;
  this->m_subBlockFinished = false;
  this->m_mainBlockFinished = false;
  this->m_ptsOffset = 54000000;
  this->m_mvcBaseViewR = false;
  this->m_extraIsoBlocks = 0;
  this->m_bluRayMode = false;
  this->m_demuxMode = false;
  return;
}

Assistant:

MuxerManager::MuxerManager(const BufferedReaderManager& readManager, AbstractMuxerFactory& factory)
    : m_metaDemuxer(readManager), m_factory(factory)
{
    m_asyncMode = true;
    m_fileWriter = nullptr;
    m_cutStart = 0;
    m_cutEnd = 0;
    m_mainMuxer = m_subMuxer = nullptr;
    m_allowStereoMux = false;
    m_interleave = false;
    m_subBlockFinished = false;
    m_mainBlockFinished = false;
    m_ptsOffset = 54000000ll;
    m_mvcBaseViewR = false;
    m_extraIsoBlocks = 0;
    m_bluRayMode = false;
    m_demuxMode = false;
}